

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

void Utils::print_vec_unicode_from_to
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *vec,int from,int to)

{
  uint uVar1;
  byte bVar2;
  undefined8 in_RAX;
  int iVar3;
  long lVar4;
  undefined1 auStack_38 [7];
  char local_31;
  
  iVar3 = to - from;
  _auStack_38 = in_RAX;
  if (iVar3 != 0 && from <= to) {
    lVar4 = (long)from;
    bVar2 = 0;
    do {
      uVar1 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar4];
      if ((bool)(lVar4 < 1 | bVar2 | uVar1 != 0)) {
        if (uVar1 == 0) {
          bVar2 = 1;
        }
        else {
          _auStack_38 = CONCAT17((char)uVar1,auStack_38);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,auStack_38 + 7,1)
          ;
        }
      }
      else {
        auStack_38 = (undefined1  [7])CONCAT16(0,auStack_38._0_6_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,auStack_38 + 6,1);
        bVar2 = 0;
      }
      lVar4 = lVar4 + 1;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  return;
}

Assistant:

void Utils::print_vec_unicode_from_to(std::vector<unsigned int>& vec, int from, int to) {
    bool lastCharIsBlank = false;
    for(int i=from; i < to; ++i){
        if(i > 0 && vec[i] == 0 && !lastCharIsBlank) {
            std::cout << (char)vec[i];
            continue;
        }
        if (vec[i] == 0) {
            lastCharIsBlank = true;
            continue;
        }
        std::cout << (char)vec[i];
    }
    std::cout << endl;
}